

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_generator.cc
# Opt level: O0

string * google::protobuf::compiler::javanano::anon_unknown_4::TrimString
                   (string *__return_storage_ptr__,string *s)

{
  size_type end;
  allocator local_21;
  long local_20;
  size_type start;
  string *s_local;
  
  start = (size_type)s;
  s_local = __return_storage_ptr__;
  local_20 = std::__cxx11::string::find_first_not_of((char *)s,0x5d3f7f);
  if (local_20 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    std::__cxx11::string::find_last_not_of((char *)start,0x5d3f7f);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,start);
  }
  return __return_storage_ptr__;
}

Assistant:

string TrimString(const string& s) {
  string::size_type start = s.find_first_not_of(" \n\r\t");
  if (start == string::npos) {
    return "";
  }
  string::size_type end = s.find_last_not_of(" \n\r\t") + 1;
  return s.substr(start, end - start);
}